

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

fstream_t * el::base::utils::File::newFileStream(string *filename)

{
  _Ios_Openmode _Var1;
  fstream *this;
  char *pcVar2;
  ulong uVar3;
  fstream *local_18;
  fstream_t *fs;
  string *filename_local;
  
  fs = (fstream_t *)filename;
  this = (fstream *)operator_new(0x210);
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  _Var1 = std::operator|(_S_out,_S_app);
  ::std::fstream::fstream(this,pcVar2,_Var1);
  local_18 = this;
  uVar3 = ::std::fstream::is_open();
  if ((uVar3 & 1) == 0) {
    safeDelete<std::fstream>((basic_fstream<char,_std::char_traits<char>_> **)&local_18);
  }
  else {
    ::std::ostream::flush();
  }
  return (fstream_t *)local_18;
}

Assistant:

base::type::fstream_t* File::newFileStream(const std::string& filename) {
  base::type::fstream_t *fs = new base::type::fstream_t(filename.c_str(),
      base::type::fstream_t::out
#if !defined(ELPP_FRESH_LOG_FILE)
      | base::type::fstream_t::app
#endif
                                                       );
#if defined(ELPP_UNICODE)
  std::locale elppUnicodeLocale("");
#  if ELPP_OS_WINDOWS
  std::locale elppUnicodeLocaleWindows(elppUnicodeLocale, new std::codecvt_utf8_utf16<wchar_t>);
  elppUnicodeLocale = elppUnicodeLocaleWindows;
#  endif // ELPP_OS_WINDOWS
  fs->imbue(elppUnicodeLocale);
#endif  // defined(ELPP_UNICODE)
  if (fs->is_open()) {
    fs->flush();
  } else {
    base::utils::safeDelete(fs);
    ELPP_INTERNAL_ERROR("Bad file [" << filename << "]", true);
  }
  return fs;
}